

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

int bcf_sr_regions_seek(bcf_sr_regions_t *reg,char *seq)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  hts_itr_t *phVar8;
  byte bVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  reg->end = -1;
  reg->iseq = -1;
  reg->start = -1;
  puVar3 = (uint *)reg->seq_hash;
  iVar11 = -1;
  if (puVar3 != (uint *)0x0) {
    uVar1 = *puVar3;
    if (uVar1 == 0) {
      uVar6 = 0;
    }
    else {
      uVar12 = (uint)*seq;
      if (*seq == '\0') {
        uVar12 = 0;
      }
      else {
        cVar5 = seq[1];
        if (cVar5 != '\0') {
          pcVar10 = seq + 2;
          do {
            uVar12 = (int)cVar5 + uVar12 * 0x1f;
            cVar5 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar5 != '\0');
        }
      }
      uVar12 = uVar12 & uVar1 - 1;
      lVar4 = *(long *)(puVar3 + 4);
      iVar11 = 1;
      uVar13 = uVar12;
      do {
        uVar2 = *(uint *)(lVar4 + (ulong)(uVar13 >> 4) * 4);
        bVar9 = (char)uVar13 * '\x02' & 0x1e;
        uVar6 = uVar2 >> bVar9;
        if (((uVar6 & 2) != 0) ||
           (((uVar6 & 1) == 0 &&
            (iVar7 = strcmp(*(char **)(*(long *)(puVar3 + 6) + (ulong)uVar13 * 8),seq), iVar7 == 0))
           )) {
          uVar6 = uVar13;
          if ((uVar2 >> bVar9 & 3) != 0) {
            uVar6 = uVar1;
          }
          break;
        }
        uVar13 = uVar13 + iVar11 & uVar1 - 1;
        iVar11 = iVar11 + 1;
        uVar6 = uVar1;
      } while (uVar13 != uVar12);
    }
    iVar11 = -1;
    if (uVar6 != uVar1) {
      reg->iseq = *(int *)(*(long *)(puVar3 + 8) + (ulong)uVar6 * 4);
      if (reg->regs == (_region_t *)0x0) {
        if (reg->itr != (hts_itr_t *)0x0) {
          hts_itr_destroy(reg->itr);
        }
        phVar8 = hts_itr_querys(reg->tbx->idx,seq,tbx_name2id,reg->tbx,hts_itr_query,tbx_readrec);
        reg->itr = phVar8;
        iVar11 = -(uint)(phVar8 == (hts_itr_t *)0x0);
      }
      else {
        reg->regs[reg->iseq].creg = -1;
        iVar11 = 0;
      }
    }
  }
  return iVar11;
}

Assistant:

int bcf_sr_regions_seek(bcf_sr_regions_t *reg, const char *seq)
{
    reg->iseq = reg->start = reg->end = -1;
    if ( khash_str2int_get(reg->seq_hash, seq, &reg->iseq) < 0 ) return -1;  // sequence seq not in regions

    // using in-memory regions
    if ( reg->regs )
    {
        reg->regs[reg->iseq].creg = -1;
        return 0;
    }

    // reading regions from tabix
    if ( reg->itr ) tbx_itr_destroy(reg->itr);
    reg->itr = tbx_itr_querys(reg->tbx, seq);
    if ( reg->itr ) return 0;

    return -1;
}